

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

void cdef_filter_8_1_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 in_XMM7 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar55;
  short sVar56;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  undefined1 in_XMM8 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar66;
  ushort uVar67;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  short sVar80;
  undefined1 in_XMM9 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ushort uVar81;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  short sVar82;
  undefined1 in_XMM10 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  short sVar89;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  short sVar109;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar110;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  undefined1 in_XMM12 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar126;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  short local_28;
  short sStack_26;
  ushort uVar37;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  
  bVar31 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar26 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar30 = (long)cdef_directions_padded[(long)dir + 2][1];
  if (block_width == 8) {
    uVar27 = pri_damping;
    if (pri_strength != 0) {
      iVar9 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      uVar27 = pri_damping - iVar9;
      if (pri_damping < iVar9) {
        uVar27 = 0;
      }
    }
    if (0 < block_height) {
      auVar32 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      auVar35._0_4_ = auVar32._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      auVar32 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][0]),0);
      auVar34._0_4_ = auVar32._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      auVar36 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][1]),0);
      uVar28 = 0;
      do {
        uVar10 = *in;
        uVar11 = in[1];
        uVar12 = in[2];
        uVar13 = in[3];
        uVar14 = in[4];
        uVar15 = in[5];
        uVar16 = in[6];
        uVar17 = in[7];
        uVar18 = in[0x90];
        uVar19 = in[0x91];
        uVar20 = in[0x92];
        uVar21 = in[0x93];
        uVar22 = in[0x94];
        uVar23 = in[0x95];
        uVar24 = in[0x96];
        uVar25 = in[0x97];
        auVar57 = lddqu(in_XMM8,*(undefined1 (*) [16])(in + lVar26));
        auVar46 = lddqu(in_XMM7,*(undefined1 (*) [16])(in + lVar26 + 0x90));
        auVar83 = lddqu(in_XMM10,*(undefined1 (*) [16])(in + -lVar26));
        auVar68 = lddqu(in_XMM9,*(undefined1 (*) [16])(in + (0x90 - lVar26)));
        auVar58._0_2_ = auVar57._0_2_ - uVar10;
        auVar58._2_2_ = auVar57._2_2_ - uVar11;
        auVar58._4_2_ = auVar57._4_2_ - uVar12;
        auVar58._6_2_ = auVar57._6_2_ - uVar13;
        auVar58._8_2_ = auVar57._8_2_ - uVar14;
        auVar58._10_2_ = auVar57._10_2_ - uVar15;
        auVar58._12_2_ = auVar57._12_2_ - uVar16;
        auVar58._14_2_ = auVar57._14_2_ - uVar17;
        auVar47._0_2_ = auVar46._0_2_ - uVar18;
        auVar47._2_2_ = auVar46._2_2_ - uVar19;
        auVar47._4_2_ = auVar46._4_2_ - uVar20;
        auVar47._6_2_ = auVar46._6_2_ - uVar21;
        auVar47._8_2_ = auVar46._8_2_ - uVar22;
        auVar47._10_2_ = auVar46._10_2_ - uVar23;
        auVar47._12_2_ = auVar46._12_2_ - uVar24;
        auVar47._14_2_ = auVar46._14_2_ - uVar25;
        auVar127 = pabsw(in_XMM13,auVar58);
        auVar57 = psraw(auVar58,0xf);
        uVar33 = (ulong)uVar27;
        uVar37 = auVar127._0_2_;
        auVar90._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar127._2_2_;
        auVar90._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar127._4_2_;
        auVar90._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar127._6_2_;
        auVar90._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar127._8_2_;
        auVar90._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar127._10_2_;
        auVar90._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar127._12_2_;
        uVar45 = auVar127._14_2_;
        auVar90._12_2_ = uVar44 >> uVar33;
        auVar90._14_2_ = uVar45 >> uVar33;
        auVar133 = pabsw(in_XMM14,auVar47);
        uVar67 = auVar133._0_2_;
        auVar137._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar133._2_2_;
        auVar137._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar133._4_2_;
        auVar137._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar133._6_2_;
        auVar137._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar133._8_2_;
        auVar137._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar133._10_2_;
        auVar137._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar133._12_2_;
        uVar81 = auVar133._14_2_;
        auVar137._12_2_ = uVar79 >> uVar33;
        auVar137._14_2_ = uVar81 >> uVar33;
        auVar46 = psraw(auVar47,0xf);
        auVar111 = psubusw(auVar35,auVar90);
        auVar91 = psubusw(auVar35,auVar137);
        sVar110 = auVar111._0_2_;
        sVar120 = auVar111._2_2_;
        sVar121 = auVar111._4_2_;
        sVar122 = auVar111._6_2_;
        sVar123 = auVar111._8_2_;
        sVar124 = auVar111._10_2_;
        sVar125 = auVar111._12_2_;
        sVar126 = auVar111._14_2_;
        sVar89 = auVar91._0_2_;
        sVar103 = auVar91._2_2_;
        sVar104 = auVar91._4_2_;
        sVar105 = auVar91._6_2_;
        sVar106 = auVar91._8_2_;
        sVar107 = auVar91._10_2_;
        sVar108 = auVar91._12_2_;
        sVar109 = auVar91._14_2_;
        auVar112._0_2_ =
             (((short)uVar37 < sVar110) * uVar37 | (ushort)((short)uVar37 >= sVar110) * sVar110) +
             auVar57._0_2_;
        auVar112._2_2_ =
             (((short)uVar39 < sVar120) * uVar39 | (ushort)((short)uVar39 >= sVar120) * sVar120) +
             auVar57._2_2_;
        auVar112._4_2_ =
             (((short)uVar40 < sVar121) * uVar40 | (ushort)((short)uVar40 >= sVar121) * sVar121) +
             auVar57._4_2_;
        auVar112._6_2_ =
             (((short)uVar41 < sVar122) * uVar41 | (ushort)((short)uVar41 >= sVar122) * sVar122) +
             auVar57._6_2_;
        auVar112._8_2_ =
             (((short)uVar42 < sVar123) * uVar42 | (ushort)((short)uVar42 >= sVar123) * sVar123) +
             auVar57._8_2_;
        auVar112._10_2_ =
             (((short)uVar43 < sVar124) * uVar43 | (ushort)((short)uVar43 >= sVar124) * sVar124) +
             auVar57._10_2_;
        auVar112._12_2_ =
             (((short)uVar44 < sVar125) * uVar44 | (ushort)((short)uVar44 >= sVar125) * sVar125) +
             auVar57._12_2_;
        auVar112._14_2_ =
             (((short)uVar45 < sVar126) * uVar45 | (ushort)((short)uVar45 >= sVar126) * sVar126) +
             auVar57._14_2_;
        auVar92._0_2_ =
             (((short)uVar67 < sVar89) * uVar67 | (ushort)((short)uVar67 >= sVar89) * sVar89) +
             auVar46._0_2_;
        auVar92._2_2_ =
             (((short)uVar74 < sVar103) * uVar74 | (ushort)((short)uVar74 >= sVar103) * sVar103) +
             auVar46._2_2_;
        auVar92._4_2_ =
             (((short)uVar75 < sVar104) * uVar75 | (ushort)((short)uVar75 >= sVar104) * sVar104) +
             auVar46._4_2_;
        auVar92._6_2_ =
             (((short)uVar76 < sVar105) * uVar76 | (ushort)((short)uVar76 >= sVar105) * sVar105) +
             auVar46._6_2_;
        auVar92._8_2_ =
             (((short)uVar77 < sVar106) * uVar77 | (ushort)((short)uVar77 >= sVar106) * sVar106) +
             auVar46._8_2_;
        auVar92._10_2_ =
             (((short)uVar78 < sVar107) * uVar78 | (ushort)((short)uVar78 >= sVar107) * sVar107) +
             auVar46._10_2_;
        auVar92._12_2_ =
             (((short)uVar79 < sVar108) * uVar79 | (ushort)((short)uVar79 >= sVar108) * sVar108) +
             auVar46._12_2_;
        auVar92._14_2_ =
             (((short)uVar81 < sVar109) * uVar81 | (ushort)((short)uVar81 >= sVar109) * sVar109) +
             auVar46._14_2_;
        auVar112 = auVar112 ^ auVar57;
        auVar92 = auVar92 ^ auVar46;
        auVar84._0_2_ = auVar83._0_2_ - uVar10;
        auVar84._2_2_ = auVar83._2_2_ - uVar11;
        auVar84._4_2_ = auVar83._4_2_ - uVar12;
        auVar84._6_2_ = auVar83._6_2_ - uVar13;
        auVar84._8_2_ = auVar83._8_2_ - uVar14;
        auVar84._10_2_ = auVar83._10_2_ - uVar15;
        auVar84._12_2_ = auVar83._12_2_ - uVar16;
        auVar84._14_2_ = auVar83._14_2_ - uVar17;
        auVar69._0_2_ = auVar68._0_2_ - uVar18;
        auVar69._2_2_ = auVar68._2_2_ - uVar19;
        auVar69._4_2_ = auVar68._4_2_ - uVar20;
        auVar69._6_2_ = auVar68._6_2_ - uVar21;
        auVar69._8_2_ = auVar68._8_2_ - uVar22;
        auVar69._10_2_ = auVar68._10_2_ - uVar23;
        auVar69._12_2_ = auVar68._12_2_ - uVar24;
        auVar69._14_2_ = auVar68._14_2_ - uVar25;
        auVar46 = pabsw(auVar127,auVar84);
        auVar83 = psraw(auVar84,0xf);
        auVar57 = pabsw(auVar133,auVar69);
        auVar68 = psraw(auVar69,0xf);
        uVar33 = (ulong)uVar27;
        uVar37 = auVar46._0_2_;
        auVar48._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar46._2_2_;
        auVar48._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar46._4_2_;
        auVar48._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar46._6_2_;
        auVar48._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar46._8_2_;
        auVar48._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar46._10_2_;
        auVar48._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar46._12_2_;
        uVar45 = auVar46._14_2_;
        auVar48._12_2_ = uVar44 >> uVar33;
        auVar48._14_2_ = uVar45 >> uVar33;
        uVar67 = auVar57._0_2_;
        auVar138._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar57._2_2_;
        auVar138._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar57._4_2_;
        auVar138._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar57._6_2_;
        auVar138._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar57._8_2_;
        auVar138._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar57._10_2_;
        auVar138._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar57._12_2_;
        uVar81 = auVar57._14_2_;
        auVar138._12_2_ = uVar79 >> uVar33;
        auVar138._14_2_ = uVar81 >> uVar33;
        auVar57 = psubusw(auVar35,auVar48);
        auVar46 = psubusw(auVar35,auVar138);
        sVar110 = auVar57._0_2_;
        sVar120 = auVar57._2_2_;
        sVar121 = auVar57._4_2_;
        sVar122 = auVar57._6_2_;
        sVar123 = auVar57._8_2_;
        sVar124 = auVar57._10_2_;
        sVar125 = auVar57._12_2_;
        sVar126 = auVar57._14_2_;
        sVar89 = auVar46._0_2_;
        sVar103 = auVar46._2_2_;
        sVar104 = auVar46._4_2_;
        sVar105 = auVar46._6_2_;
        sVar106 = auVar46._8_2_;
        sVar107 = auVar46._10_2_;
        sVar108 = auVar46._12_2_;
        sVar109 = auVar46._14_2_;
        auVar59._0_2_ =
             (((short)uVar37 < sVar110) * uVar37 | (ushort)((short)uVar37 >= sVar110) * sVar110) +
             auVar83._0_2_;
        auVar59._2_2_ =
             (((short)uVar39 < sVar120) * uVar39 | (ushort)((short)uVar39 >= sVar120) * sVar120) +
             auVar83._2_2_;
        auVar59._4_2_ =
             (((short)uVar40 < sVar121) * uVar40 | (ushort)((short)uVar40 >= sVar121) * sVar121) +
             auVar83._4_2_;
        auVar59._6_2_ =
             (((short)uVar41 < sVar122) * uVar41 | (ushort)((short)uVar41 >= sVar122) * sVar122) +
             auVar83._6_2_;
        auVar59._8_2_ =
             (((short)uVar42 < sVar123) * uVar42 | (ushort)((short)uVar42 >= sVar123) * sVar123) +
             auVar83._8_2_;
        auVar59._10_2_ =
             (((short)uVar43 < sVar124) * uVar43 | (ushort)((short)uVar43 >= sVar124) * sVar124) +
             auVar83._10_2_;
        auVar59._12_2_ =
             (((short)uVar44 < sVar125) * uVar44 | (ushort)((short)uVar44 >= sVar125) * sVar125) +
             auVar83._12_2_;
        auVar59._14_2_ =
             (((short)uVar45 < sVar126) * uVar45 | (ushort)((short)uVar45 >= sVar126) * sVar126) +
             auVar83._14_2_;
        auVar49._0_2_ =
             (((short)uVar67 < sVar89) * uVar67 | (ushort)((short)uVar67 >= sVar89) * sVar89) +
             auVar68._0_2_;
        auVar49._2_2_ =
             (((short)uVar74 < sVar103) * uVar74 | (ushort)((short)uVar74 >= sVar103) * sVar103) +
             auVar68._2_2_;
        auVar49._4_2_ =
             (((short)uVar75 < sVar104) * uVar75 | (ushort)((short)uVar75 >= sVar104) * sVar104) +
             auVar68._4_2_;
        auVar49._6_2_ =
             (((short)uVar76 < sVar105) * uVar76 | (ushort)((short)uVar76 >= sVar105) * sVar105) +
             auVar68._6_2_;
        auVar49._8_2_ =
             (((short)uVar77 < sVar106) * uVar77 | (ushort)((short)uVar77 >= sVar106) * sVar106) +
             auVar68._8_2_;
        auVar49._10_2_ =
             (((short)uVar78 < sVar107) * uVar78 | (ushort)((short)uVar78 >= sVar107) * sVar107) +
             auVar68._10_2_;
        auVar49._12_2_ =
             (((short)uVar79 < sVar108) * uVar79 | (ushort)((short)uVar79 >= sVar108) * sVar108) +
             auVar68._12_2_;
        auVar49._14_2_ =
             (((short)uVar81 < sVar109) * uVar81 | (ushort)((short)uVar81 >= sVar109) * sVar109) +
             auVar68._14_2_;
        auVar59 = auVar59 ^ auVar83;
        auVar49 = auVar49 ^ auVar68;
        auVar91 = lddqu(auVar92,*(undefined1 (*) [16])(in + lVar30));
        auVar111 = lddqu(auVar112,*(undefined1 (*) [16])(in + lVar30 + 0x90));
        auVar57 = lddqu(auVar83,*(undefined1 (*) [16])(in + -lVar30));
        auVar46 = lddqu(auVar68,*(undefined1 (*) [16])(in + (0x90 - lVar30)));
        auVar93._0_2_ = auVar91._0_2_ - uVar10;
        auVar93._2_2_ = auVar91._2_2_ - uVar11;
        auVar93._4_2_ = auVar91._4_2_ - uVar12;
        auVar93._6_2_ = auVar91._6_2_ - uVar13;
        auVar93._8_2_ = auVar91._8_2_ - uVar14;
        auVar93._10_2_ = auVar91._10_2_ - uVar15;
        auVar93._12_2_ = auVar91._12_2_ - uVar16;
        auVar93._14_2_ = auVar91._14_2_ - uVar17;
        auVar113._0_2_ = auVar111._0_2_ - uVar18;
        auVar113._2_2_ = auVar111._2_2_ - uVar19;
        auVar113._4_2_ = auVar111._4_2_ - uVar20;
        auVar113._6_2_ = auVar111._6_2_ - uVar21;
        auVar113._8_2_ = auVar111._8_2_ - uVar22;
        auVar113._10_2_ = auVar111._10_2_ - uVar23;
        auVar113._12_2_ = auVar111._12_2_ - uVar24;
        auVar113._14_2_ = auVar111._14_2_ - uVar25;
        auVar91 = pabsw(auVar138,auVar93);
        auVar68 = psraw(auVar93,0xf);
        auVar34 = pabsw(auVar34,auVar113);
        auVar83 = psraw(auVar113,0xf);
        uVar67 = auVar91._0_2_;
        auVar128._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar91._2_2_;
        auVar128._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar91._4_2_;
        auVar128._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar91._6_2_;
        auVar128._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar91._8_2_;
        auVar128._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar91._10_2_;
        auVar128._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar91._12_2_;
        uVar81 = auVar91._14_2_;
        auVar128._12_2_ = uVar79 >> uVar33;
        auVar128._14_2_ = uVar81 >> uVar33;
        uVar37 = auVar34._0_2_;
        auVar38._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar34._2_2_;
        auVar38._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar34._4_2_;
        auVar38._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar34._6_2_;
        auVar38._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar34._8_2_;
        auVar38._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar34._10_2_;
        auVar38._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar34._12_2_;
        uVar45 = auVar34._14_2_;
        auVar38._12_2_ = uVar44 >> uVar33;
        auVar38._14_2_ = uVar45 >> uVar33;
        auVar111 = psubusw(auVar35,auVar128);
        auVar91 = psubusw(auVar35,auVar38);
        sVar110 = auVar111._0_2_;
        sVar120 = auVar111._2_2_;
        sVar121 = auVar111._4_2_;
        sVar122 = auVar111._6_2_;
        sVar123 = auVar111._8_2_;
        sVar124 = auVar111._10_2_;
        sVar125 = auVar111._12_2_;
        sVar126 = auVar111._14_2_;
        sVar89 = auVar91._0_2_;
        sVar103 = auVar91._2_2_;
        sVar104 = auVar91._4_2_;
        sVar105 = auVar91._6_2_;
        sVar106 = auVar91._8_2_;
        sVar107 = auVar91._10_2_;
        sVar108 = auVar91._12_2_;
        sVar109 = auVar91._14_2_;
        auVar134._0_2_ =
             (((short)uVar67 < sVar110) * uVar67 | (ushort)((short)uVar67 >= sVar110) * sVar110) +
             auVar68._0_2_;
        auVar134._2_2_ =
             (((short)uVar74 < sVar120) * uVar74 | (ushort)((short)uVar74 >= sVar120) * sVar120) +
             auVar68._2_2_;
        auVar134._4_2_ =
             (((short)uVar75 < sVar121) * uVar75 | (ushort)((short)uVar75 >= sVar121) * sVar121) +
             auVar68._4_2_;
        auVar134._6_2_ =
             (((short)uVar76 < sVar122) * uVar76 | (ushort)((short)uVar76 >= sVar122) * sVar122) +
             auVar68._6_2_;
        auVar134._8_2_ =
             (((short)uVar77 < sVar123) * uVar77 | (ushort)((short)uVar77 >= sVar123) * sVar123) +
             auVar68._8_2_;
        auVar134._10_2_ =
             (((short)uVar78 < sVar124) * uVar78 | (ushort)((short)uVar78 >= sVar124) * sVar124) +
             auVar68._10_2_;
        auVar134._12_2_ =
             (((short)uVar79 < sVar125) * uVar79 | (ushort)((short)uVar79 >= sVar125) * sVar125) +
             auVar68._12_2_;
        auVar134._14_2_ =
             (((short)uVar81 < sVar126) * uVar81 | (ushort)((short)uVar81 >= sVar126) * sVar126) +
             auVar68._14_2_;
        auVar129._0_2_ =
             (((short)uVar37 < sVar89) * uVar37 | (ushort)((short)uVar37 >= sVar89) * sVar89) +
             auVar83._0_2_;
        auVar129._2_2_ =
             (((short)uVar39 < sVar103) * uVar39 | (ushort)((short)uVar39 >= sVar103) * sVar103) +
             auVar83._2_2_;
        auVar129._4_2_ =
             (((short)uVar40 < sVar104) * uVar40 | (ushort)((short)uVar40 >= sVar104) * sVar104) +
             auVar83._4_2_;
        auVar129._6_2_ =
             (((short)uVar41 < sVar105) * uVar41 | (ushort)((short)uVar41 >= sVar105) * sVar105) +
             auVar83._6_2_;
        auVar129._8_2_ =
             (((short)uVar42 < sVar106) * uVar42 | (ushort)((short)uVar42 >= sVar106) * sVar106) +
             auVar83._8_2_;
        auVar129._10_2_ =
             (((short)uVar43 < sVar107) * uVar43 | (ushort)((short)uVar43 >= sVar107) * sVar107) +
             auVar83._10_2_;
        auVar129._12_2_ =
             (((short)uVar44 < sVar108) * uVar44 | (ushort)((short)uVar44 >= sVar108) * sVar108) +
             auVar83._12_2_;
        auVar129._14_2_ =
             (((short)uVar45 < sVar109) * uVar45 | (ushort)((short)uVar45 >= sVar109) * sVar109) +
             auVar83._14_2_;
        in_XMM14 = auVar134 ^ auVar68;
        in_XMM13 = auVar129 ^ auVar83;
        auVar85._0_2_ = auVar57._0_2_ - uVar10;
        auVar85._2_2_ = auVar57._2_2_ - uVar11;
        auVar85._4_2_ = auVar57._4_2_ - uVar12;
        auVar85._6_2_ = auVar57._6_2_ - uVar13;
        auVar85._8_2_ = auVar57._8_2_ - uVar14;
        auVar85._10_2_ = auVar57._10_2_ - uVar15;
        auVar85._12_2_ = auVar57._12_2_ - uVar16;
        auVar85._14_2_ = auVar57._14_2_ - uVar17;
        auVar70._0_2_ = auVar46._0_2_ - uVar18;
        auVar70._2_2_ = auVar46._2_2_ - uVar19;
        auVar70._4_2_ = auVar46._4_2_ - uVar20;
        auVar70._6_2_ = auVar46._6_2_ - uVar21;
        auVar70._8_2_ = auVar46._8_2_ - uVar22;
        auVar70._10_2_ = auVar46._10_2_ - uVar23;
        auVar70._12_2_ = auVar46._12_2_ - uVar24;
        auVar70._14_2_ = auVar46._14_2_ - uVar25;
        auVar34 = pabsw(auVar34,auVar85);
        auVar46 = pabsw(auVar38,auVar70);
        uVar33 = (ulong)uVar27;
        uVar37 = auVar34._0_2_;
        auVar114._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar34._2_2_;
        auVar114._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar34._4_2_;
        auVar114._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar34._6_2_;
        auVar114._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar34._8_2_;
        auVar114._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar34._10_2_;
        auVar114._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar34._12_2_;
        uVar45 = auVar34._14_2_;
        auVar114._12_2_ = uVar44 >> uVar33;
        auVar114._14_2_ = uVar45 >> uVar33;
        uVar67 = auVar46._0_2_;
        auVar139._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar46._2_2_;
        auVar139._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar46._4_2_;
        auVar139._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar46._6_2_;
        auVar139._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar46._8_2_;
        auVar139._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar46._10_2_;
        auVar139._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar46._12_2_;
        uVar81 = auVar46._14_2_;
        auVar139._12_2_ = uVar79 >> uVar33;
        auVar139._14_2_ = uVar81 >> uVar33;
        auVar34 = psubusw(auVar35,auVar114);
        auVar57 = psubusw(auVar35,auVar139);
        sVar89 = auVar34._0_2_;
        sVar103 = auVar34._2_2_;
        sVar104 = auVar34._4_2_;
        sVar105 = auVar34._6_2_;
        sVar106 = auVar34._8_2_;
        sVar107 = auVar34._10_2_;
        sVar108 = auVar34._12_2_;
        sVar109 = auVar34._14_2_;
        sVar110 = auVar57._0_2_;
        sVar120 = auVar57._2_2_;
        sVar121 = auVar57._4_2_;
        sVar122 = auVar57._6_2_;
        sVar123 = auVar57._8_2_;
        sVar124 = auVar57._10_2_;
        sVar125 = auVar57._12_2_;
        sVar126 = auVar57._14_2_;
        in_XMM10 = psraw(auVar85,0xf);
        auVar94._0_2_ =
             (((short)uVar37 < sVar89) * uVar37 | (ushort)((short)uVar37 >= sVar89) * sVar89) +
             in_XMM10._0_2_;
        auVar94._2_2_ =
             (((short)uVar39 < sVar103) * uVar39 | (ushort)((short)uVar39 >= sVar103) * sVar103) +
             in_XMM10._2_2_;
        auVar94._4_2_ =
             (((short)uVar40 < sVar104) * uVar40 | (ushort)((short)uVar40 >= sVar104) * sVar104) +
             in_XMM10._4_2_;
        auVar94._6_2_ =
             (((short)uVar41 < sVar105) * uVar41 | (ushort)((short)uVar41 >= sVar105) * sVar105) +
             in_XMM10._6_2_;
        auVar94._8_2_ =
             (((short)uVar42 < sVar106) * uVar42 | (ushort)((short)uVar42 >= sVar106) * sVar106) +
             in_XMM10._8_2_;
        auVar94._10_2_ =
             (((short)uVar43 < sVar107) * uVar43 | (ushort)((short)uVar43 >= sVar107) * sVar107) +
             in_XMM10._10_2_;
        auVar94._12_2_ =
             (((short)uVar44 < sVar108) * uVar44 | (ushort)((short)uVar44 >= sVar108) * sVar108) +
             in_XMM10._12_2_;
        auVar94._14_2_ =
             (((short)uVar45 < sVar109) * uVar45 | (ushort)((short)uVar45 >= sVar109) * sVar109) +
             in_XMM10._14_2_;
        auVar94 = auVar94 ^ in_XMM10;
        in_XMM9 = psraw(auVar70,0xf);
        auVar115._0_2_ =
             (((short)uVar67 < sVar110) * uVar67 | (ushort)((short)uVar67 >= sVar110) * sVar110) +
             in_XMM9._0_2_;
        auVar115._2_2_ =
             (((short)uVar74 < sVar120) * uVar74 | (ushort)((short)uVar74 >= sVar120) * sVar120) +
             in_XMM9._2_2_;
        auVar115._4_2_ =
             (((short)uVar75 < sVar121) * uVar75 | (ushort)((short)uVar75 >= sVar121) * sVar121) +
             in_XMM9._4_2_;
        auVar115._6_2_ =
             (((short)uVar76 < sVar122) * uVar76 | (ushort)((short)uVar76 >= sVar122) * sVar122) +
             in_XMM9._6_2_;
        auVar115._8_2_ =
             (((short)uVar77 < sVar123) * uVar77 | (ushort)((short)uVar77 >= sVar123) * sVar123) +
             in_XMM9._8_2_;
        auVar115._10_2_ =
             (((short)uVar78 < sVar124) * uVar78 | (ushort)((short)uVar78 >= sVar124) * sVar124) +
             in_XMM9._10_2_;
        auVar115._12_2_ =
             (((short)uVar79 < sVar125) * uVar79 | (ushort)((short)uVar79 >= sVar125) * sVar125) +
             in_XMM9._12_2_;
        auVar115._14_2_ =
             (((short)uVar81 < sVar126) * uVar81 | (ushort)((short)uVar81 >= sVar126) * sVar126) +
             in_XMM9._14_2_;
        auVar115 = auVar115 ^ in_XMM9;
        local_28 = auVar32._0_2_;
        sStack_26 = auVar32._2_2_;
        in_XMM8._0_2_ = (auVar59._0_2_ + auVar112._0_2_) * local_28;
        in_XMM8._2_2_ = (auVar59._2_2_ + auVar112._2_2_) * sStack_26;
        in_XMM8._4_2_ = (auVar59._4_2_ + auVar112._4_2_) * local_28;
        in_XMM8._6_2_ = (auVar59._6_2_ + auVar112._6_2_) * sStack_26;
        in_XMM8._8_2_ = (auVar59._8_2_ + auVar112._8_2_) * local_28;
        in_XMM8._10_2_ = (auVar59._10_2_ + auVar112._10_2_) * sStack_26;
        in_XMM8._12_2_ = (auVar59._12_2_ + auVar112._12_2_) * local_28;
        in_XMM8._14_2_ = (auVar59._14_2_ + auVar112._14_2_) * sStack_26;
        sVar89 = auVar36._0_2_;
        sVar103 = auVar36._2_2_;
        auVar95._0_2_ = (auVar94._0_2_ + in_XMM14._0_2_) * sVar89 + in_XMM8._0_2_;
        auVar95._2_2_ = (auVar94._2_2_ + in_XMM14._2_2_) * sVar103 + in_XMM8._2_2_;
        auVar95._4_2_ = (auVar94._4_2_ + in_XMM14._4_2_) * sVar89 + in_XMM8._4_2_;
        auVar95._6_2_ = (auVar94._6_2_ + in_XMM14._6_2_) * sVar103 + in_XMM8._6_2_;
        auVar95._8_2_ = (auVar94._8_2_ + in_XMM14._8_2_) * sVar89 + in_XMM8._8_2_;
        auVar95._10_2_ = (auVar94._10_2_ + in_XMM14._10_2_) * sVar103 + in_XMM8._10_2_;
        auVar95._12_2_ = (auVar94._12_2_ + in_XMM14._12_2_) * sVar89 + in_XMM8._12_2_;
        auVar95._14_2_ = (auVar94._14_2_ + in_XMM14._14_2_) * sVar103 + in_XMM8._14_2_;
        in_XMM7._0_2_ = (auVar49._0_2_ + auVar92._0_2_) * local_28;
        in_XMM7._2_2_ = (auVar49._2_2_ + auVar92._2_2_) * sStack_26;
        in_XMM7._4_2_ = (auVar49._4_2_ + auVar92._4_2_) * local_28;
        in_XMM7._6_2_ = (auVar49._6_2_ + auVar92._6_2_) * sStack_26;
        in_XMM7._8_2_ = (auVar49._8_2_ + auVar92._8_2_) * local_28;
        in_XMM7._10_2_ = (auVar49._10_2_ + auVar92._10_2_) * sStack_26;
        in_XMM7._12_2_ = (auVar49._12_2_ + auVar92._12_2_) * local_28;
        in_XMM7._14_2_ = (auVar49._14_2_ + auVar92._14_2_) * sStack_26;
        auVar116._0_2_ = (auVar115._0_2_ + in_XMM13._0_2_) * sVar89 + in_XMM7._0_2_;
        auVar116._2_2_ = (auVar115._2_2_ + in_XMM13._2_2_) * sVar103 + in_XMM7._2_2_;
        auVar116._4_2_ = (auVar115._4_2_ + in_XMM13._4_2_) * sVar89 + in_XMM7._4_2_;
        auVar116._6_2_ = (auVar115._6_2_ + in_XMM13._6_2_) * sVar103 + in_XMM7._6_2_;
        auVar116._8_2_ = (auVar115._8_2_ + in_XMM13._8_2_) * sVar89 + in_XMM7._8_2_;
        auVar116._10_2_ = (auVar115._10_2_ + in_XMM13._10_2_) * sVar103 + in_XMM7._10_2_;
        auVar116._12_2_ = (auVar115._12_2_ + in_XMM13._12_2_) * sVar89 + in_XMM7._12_2_;
        auVar116._14_2_ = (auVar115._14_2_ + in_XMM13._14_2_) * sVar103 + in_XMM7._14_2_;
        auVar34 = psraw(auVar95,0xf);
        auVar46 = pmovsxbw(auVar46,0x808080808080808);
        auVar96._0_2_ = auVar95._0_2_ + auVar46._0_2_ + auVar34._0_2_;
        auVar96._2_2_ = auVar95._2_2_ + auVar46._2_2_ + auVar34._2_2_;
        auVar96._4_2_ = auVar95._4_2_ + auVar46._4_2_ + auVar34._4_2_;
        auVar96._6_2_ = auVar95._6_2_ + auVar46._6_2_ + auVar34._6_2_;
        auVar96._8_2_ = auVar95._8_2_ + auVar46._8_2_ + auVar34._8_2_;
        auVar96._10_2_ = auVar95._10_2_ + auVar46._10_2_ + auVar34._10_2_;
        auVar96._12_2_ = auVar95._12_2_ + auVar46._12_2_ + auVar34._12_2_;
        auVar96._14_2_ = auVar95._14_2_ + auVar46._14_2_ + auVar34._14_2_;
        auVar34 = psraw(auVar116,0xf);
        auVar117._0_2_ = auVar116._0_2_ + auVar46._0_2_ + auVar34._0_2_;
        auVar117._2_2_ = auVar116._2_2_ + auVar46._2_2_ + auVar34._2_2_;
        auVar117._4_2_ = auVar116._4_2_ + auVar46._4_2_ + auVar34._4_2_;
        auVar117._6_2_ = auVar116._6_2_ + auVar46._6_2_ + auVar34._6_2_;
        auVar117._8_2_ = auVar116._8_2_ + auVar46._8_2_ + auVar34._8_2_;
        auVar117._10_2_ = auVar116._10_2_ + auVar46._10_2_ + auVar34._10_2_;
        auVar117._12_2_ = auVar116._12_2_ + auVar46._12_2_ + auVar34._12_2_;
        auVar117._14_2_ = auVar116._14_2_ + auVar46._14_2_ + auVar34._14_2_;
        auVar46 = psraw(auVar96,4);
        sVar89 = auVar46._0_2_ + uVar10;
        sVar103 = auVar46._2_2_ + uVar11;
        sVar104 = auVar46._4_2_ + uVar12;
        sVar105 = auVar46._6_2_ + uVar13;
        sVar106 = auVar46._8_2_ + uVar14;
        sVar107 = auVar46._10_2_ + uVar15;
        sVar108 = auVar46._12_2_ + uVar16;
        sVar109 = auVar46._14_2_ + uVar17;
        auVar46 = psraw(auVar117,4);
        sVar110 = auVar46._0_2_ + uVar18;
        sVar120 = auVar46._2_2_ + uVar19;
        sVar121 = auVar46._4_2_ + uVar20;
        sVar122 = auVar46._6_2_ + uVar21;
        sVar123 = auVar46._8_2_ + uVar22;
        sVar124 = auVar46._10_2_ + uVar23;
        sVar125 = auVar46._12_2_ + uVar24;
        sVar126 = auVar46._14_2_ + uVar25;
        *(char *)((long)dest + 8) = (0 < sVar89) * (sVar89 < 0x100) * (char)sVar89 - (0xff < sVar89)
        ;
        *(char *)((long)dest + 9) =
             (0 < sVar103) * (sVar103 < 0x100) * (char)sVar103 - (0xff < sVar103);
        *(char *)((long)dest + 10) =
             (0 < sVar104) * (sVar104 < 0x100) * (char)sVar104 - (0xff < sVar104);
        *(char *)((long)dest + 0xb) =
             (0 < sVar105) * (sVar105 < 0x100) * (char)sVar105 - (0xff < sVar105);
        *(char *)((long)dest + 0xc) =
             (0 < sVar106) * (sVar106 < 0x100) * (char)sVar106 - (0xff < sVar106);
        *(char *)((long)dest + 0xd) =
             (0 < sVar107) * (sVar107 < 0x100) * (char)sVar107 - (0xff < sVar107);
        *(char *)((long)dest + 0xe) =
             (0 < sVar108) * (sVar108 < 0x100) * (char)sVar108 - (0xff < sVar108);
        *(char *)((long)dest + 0xf) =
             (0 < sVar109) * (sVar109 < 0x100) * (char)sVar109 - (0xff < sVar109);
        pcVar1 = (char *)((long)dest + (long)dstride);
        *pcVar1 = (0 < sVar110) * (sVar110 < 0x100) * (char)sVar110 - (0xff < sVar110);
        pcVar1[1] = (0 < sVar120) * (sVar120 < 0x100) * (char)sVar120 - (0xff < sVar120);
        pcVar1[2] = (0 < sVar121) * (sVar121 < 0x100) * (char)sVar121 - (0xff < sVar121);
        pcVar1[3] = (0 < sVar122) * (sVar122 < 0x100) * (char)sVar122 - (0xff < sVar122);
        pcVar1[4] = (0 < sVar123) * (sVar123 < 0x100) * (char)sVar123 - (0xff < sVar123);
        pcVar1[5] = (0 < sVar124) * (sVar124 < 0x100) * (char)sVar124 - (0xff < sVar124);
        pcVar1[6] = (0 < sVar125) * (sVar125 < 0x100) * (char)sVar125 - (0xff < sVar125);
        pcVar1[7] = (0 < sVar126) * (sVar126 < 0x100) * (char)sVar126 - (0xff < sVar126);
        uVar28 = uVar28 + 2;
        in = in + 0x120;
        dest = (void *)((long)dest + (long)dstride * 2);
      } while (uVar28 < (uint)block_height);
    }
  }
  else {
    uVar27 = pri_damping;
    if (pri_strength != 0) {
      iVar9 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      uVar27 = pri_damping - iVar9;
      if (pri_damping < iVar9) {
        uVar27 = 0;
      }
    }
    if (0 < block_height) {
      auVar32 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      auVar35 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][0]),0);
      auVar36._0_4_ = auVar35._0_4_;
      auVar36._4_4_ = auVar36._0_4_;
      auVar36._8_4_ = auVar36._0_4_;
      auVar36._12_4_ = auVar36._0_4_;
      auVar34 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][1]),0);
      lVar29 = (long)dstride;
      uVar28 = 0;
      do {
        uVar2 = *(undefined8 *)in;
        uVar3 = *(undefined8 *)(in + 0x90);
        uVar4 = *(undefined8 *)(in + 0x120);
        uVar5 = *(undefined8 *)(in + 0x1b0);
        uVar6 = *(undefined8 *)(in + lVar26);
        uVar7 = *(undefined8 *)(in + lVar26 + 0x90);
        uVar33 = *(ulong *)(in + lVar26 + 0x120);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar33;
        uVar8 = *(undefined8 *)(in + lVar26 + 0x1b0);
        sVar104 = (short)uVar3;
        auVar57._0_2_ = (short)uVar7 - sVar104;
        sVar105 = (short)((ulong)uVar3 >> 0x10);
        auVar57._2_2_ = (short)((ulong)uVar7 >> 0x10) - sVar105;
        sVar106 = (short)((ulong)uVar3 >> 0x20);
        auVar57._4_2_ = (short)((ulong)uVar7 >> 0x20) - sVar106;
        sVar107 = (short)((ulong)uVar3 >> 0x30);
        auVar57._6_2_ = (short)((ulong)uVar7 >> 0x30) - sVar107;
        sVar108 = (short)uVar2;
        auVar57._8_2_ = (short)uVar6 - sVar108;
        sVar109 = (short)((ulong)uVar2 >> 0x10);
        auVar57._10_2_ = (short)((ulong)uVar6 >> 0x10) - sVar109;
        sVar110 = (short)((ulong)uVar2 >> 0x20);
        auVar57._12_2_ = (short)((ulong)uVar6 >> 0x20) - sVar110;
        sVar120 = (short)((ulong)uVar2 >> 0x30);
        auVar57._14_2_ = (short)((ulong)uVar6 >> 0x30) - sVar120;
        sVar121 = (short)uVar5;
        auVar97._0_2_ = (short)uVar8 - sVar121;
        sVar122 = (short)((ulong)uVar5 >> 0x10);
        auVar97._2_2_ = (short)((ulong)uVar8 >> 0x10) - sVar122;
        sVar123 = (short)((ulong)uVar5 >> 0x20);
        auVar97._4_2_ = (short)((ulong)uVar8 >> 0x20) - sVar123;
        sVar124 = (short)((ulong)uVar5 >> 0x30);
        auVar97._6_2_ = (short)((ulong)uVar8 >> 0x30) - sVar124;
        sVar125 = (short)uVar4;
        auVar97._8_2_ = (short)uVar33 - sVar125;
        sVar126 = (short)((ulong)uVar4 >> 0x10);
        auVar97._10_2_ = (short)(uVar33 >> 0x10) - sVar126;
        sVar80 = (short)((ulong)uVar4 >> 0x20);
        auVar97._12_2_ = (short)(uVar33 >> 0x20) - sVar80;
        sVar82 = (short)((ulong)uVar4 >> 0x30);
        auVar97._14_2_ = (short)(uVar33 >> 0x30) - sVar82;
        auVar68 = pabsw(auVar91,auVar57);
        auVar46 = psraw(auVar57,0xf);
        auVar57 = pabsw(in_XMM12,auVar97);
        auVar83 = psraw(auVar97,0xf);
        uVar33 = (ulong)uVar27;
        uVar37 = auVar68._0_2_;
        auVar127._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar68._2_2_;
        auVar127._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar68._4_2_;
        auVar127._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar68._6_2_;
        auVar127._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar68._8_2_;
        auVar127._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar68._10_2_;
        auVar127._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar68._12_2_;
        uVar45 = auVar68._14_2_;
        auVar127._12_2_ = uVar44 >> uVar33;
        auVar127._14_2_ = uVar45 >> uVar33;
        uVar67 = auVar57._0_2_;
        auVar130._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar57._2_2_;
        auVar130._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar57._4_2_;
        auVar130._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar57._6_2_;
        auVar130._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar57._8_2_;
        auVar130._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar57._10_2_;
        auVar130._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar57._12_2_;
        uVar81 = auVar57._14_2_;
        auVar130._12_2_ = uVar79 >> uVar33;
        auVar130._14_2_ = uVar81 >> uVar33;
        auVar68 = psubusw(auVar32,auVar127);
        auVar57 = psubusw(auVar32,auVar130);
        sVar56 = auVar68._0_2_;
        sVar60 = auVar68._2_2_;
        sVar61 = auVar68._4_2_;
        sVar62 = auVar68._6_2_;
        sVar63 = auVar68._8_2_;
        sVar64 = auVar68._10_2_;
        sVar65 = auVar68._12_2_;
        sVar66 = auVar68._14_2_;
        sVar89 = auVar57._0_2_;
        sVar103 = auVar57._2_2_;
        sVar50 = auVar57._4_2_;
        sVar51 = auVar57._6_2_;
        sVar52 = auVar57._8_2_;
        sVar53 = auVar57._10_2_;
        sVar54 = auVar57._12_2_;
        sVar55 = auVar57._14_2_;
        auVar86._0_2_ =
             (((short)uVar37 < sVar56) * uVar37 | (ushort)((short)uVar37 >= sVar56) * sVar56) +
             auVar46._0_2_;
        auVar86._2_2_ =
             (((short)uVar39 < sVar60) * uVar39 | (ushort)((short)uVar39 >= sVar60) * sVar60) +
             auVar46._2_2_;
        auVar86._4_2_ =
             (((short)uVar40 < sVar61) * uVar40 | (ushort)((short)uVar40 >= sVar61) * sVar61) +
             auVar46._4_2_;
        auVar86._6_2_ =
             (((short)uVar41 < sVar62) * uVar41 | (ushort)((short)uVar41 >= sVar62) * sVar62) +
             auVar46._6_2_;
        auVar86._8_2_ =
             (((short)uVar42 < sVar63) * uVar42 | (ushort)((short)uVar42 >= sVar63) * sVar63) +
             auVar46._8_2_;
        auVar86._10_2_ =
             (((short)uVar43 < sVar64) * uVar43 | (ushort)((short)uVar43 >= sVar64) * sVar64) +
             auVar46._10_2_;
        auVar86._12_2_ =
             (((short)uVar44 < sVar65) * uVar44 | (ushort)((short)uVar44 >= sVar65) * sVar65) +
             auVar46._12_2_;
        auVar86._14_2_ =
             (((short)uVar45 < sVar66) * uVar45 | (ushort)((short)uVar45 >= sVar66) * sVar66) +
             auVar46._14_2_;
        auVar133._0_2_ =
             (((short)uVar67 < sVar89) * uVar67 | (ushort)((short)uVar67 >= sVar89) * sVar89) +
             auVar83._0_2_;
        auVar133._2_2_ =
             (((short)uVar74 < sVar103) * uVar74 | (ushort)((short)uVar74 >= sVar103) * sVar103) +
             auVar83._2_2_;
        auVar133._4_2_ =
             (((short)uVar75 < sVar50) * uVar75 | (ushort)((short)uVar75 >= sVar50) * sVar50) +
             auVar83._4_2_;
        auVar133._6_2_ =
             (((short)uVar76 < sVar51) * uVar76 | (ushort)((short)uVar76 >= sVar51) * sVar51) +
             auVar83._6_2_;
        auVar133._8_2_ =
             (((short)uVar77 < sVar52) * uVar77 | (ushort)((short)uVar77 >= sVar52) * sVar52) +
             auVar83._8_2_;
        auVar133._10_2_ =
             (((short)uVar78 < sVar53) * uVar78 | (ushort)((short)uVar78 >= sVar53) * sVar53) +
             auVar83._10_2_;
        auVar133._12_2_ =
             (((short)uVar79 < sVar54) * uVar79 | (ushort)((short)uVar79 >= sVar54) * sVar54) +
             auVar83._12_2_;
        auVar133._14_2_ =
             (((short)uVar81 < sVar55) * uVar81 | (ushort)((short)uVar81 >= sVar55) * sVar55) +
             auVar83._14_2_;
        auVar86 = auVar86 ^ auVar46;
        auVar133 = auVar133 ^ auVar83;
        uVar2 = *(undefined8 *)(in + -lVar26);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar26));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar26));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar26));
        auVar98._0_2_ = (short)uVar3 - sVar104;
        auVar98._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar105;
        auVar98._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar106;
        auVar98._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar107;
        auVar98._8_2_ = (short)uVar2 - sVar108;
        auVar98._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar109;
        auVar98._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar110;
        auVar98._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar120;
        auVar118._0_2_ = (short)uVar5 - sVar121;
        auVar118._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar122;
        auVar118._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar123;
        auVar118._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar124;
        auVar118._8_2_ = (short)uVar4 - sVar125;
        auVar118._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar126;
        auVar118._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar80;
        auVar118._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar82;
        auVar131 = pabsw(auVar130,auVar98);
        auVar91 = psraw(auVar98,0xf);
        auVar135 = pabsw(in_XMM14,auVar118);
        auVar127 = psraw(auVar118,0xf);
        uVar33 = (ulong)uVar27;
        uVar37 = auVar131._0_2_;
        auVar68._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar131._2_2_;
        auVar68._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar131._4_2_;
        auVar68._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar131._6_2_;
        auVar68._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar131._8_2_;
        auVar68._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar131._10_2_;
        auVar68._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar131._12_2_;
        uVar45 = auVar131._14_2_;
        auVar68._12_2_ = uVar44 >> uVar33;
        auVar68._14_2_ = uVar45 >> uVar33;
        uVar67 = auVar135._0_2_;
        auVar140._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar135._2_2_;
        auVar140._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar135._4_2_;
        auVar140._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar135._6_2_;
        auVar140._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar135._8_2_;
        auVar140._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar135._10_2_;
        auVar140._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar135._12_2_;
        uVar81 = auVar135._14_2_;
        auVar140._12_2_ = uVar79 >> uVar33;
        auVar140._14_2_ = uVar81 >> uVar33;
        auVar57 = psubusw(auVar32,auVar68);
        auVar46 = psubusw(auVar32,auVar140);
        sVar56 = auVar57._0_2_;
        sVar60 = auVar57._2_2_;
        sVar61 = auVar57._4_2_;
        sVar62 = auVar57._6_2_;
        sVar63 = auVar57._8_2_;
        sVar64 = auVar57._10_2_;
        sVar65 = auVar57._12_2_;
        sVar66 = auVar57._14_2_;
        sVar89 = auVar46._0_2_;
        sVar103 = auVar46._2_2_;
        sVar50 = auVar46._4_2_;
        sVar51 = auVar46._6_2_;
        sVar52 = auVar46._8_2_;
        sVar53 = auVar46._10_2_;
        sVar54 = auVar46._12_2_;
        sVar55 = auVar46._14_2_;
        auVar111._0_2_ =
             (((short)uVar37 < sVar56) * uVar37 | (ushort)((short)uVar37 >= sVar56) * sVar56) +
             auVar91._0_2_;
        auVar111._2_2_ =
             (((short)uVar39 < sVar60) * uVar39 | (ushort)((short)uVar39 >= sVar60) * sVar60) +
             auVar91._2_2_;
        auVar111._4_2_ =
             (((short)uVar40 < sVar61) * uVar40 | (ushort)((short)uVar40 >= sVar61) * sVar61) +
             auVar91._4_2_;
        auVar111._6_2_ =
             (((short)uVar41 < sVar62) * uVar41 | (ushort)((short)uVar41 >= sVar62) * sVar62) +
             auVar91._6_2_;
        auVar111._8_2_ =
             (((short)uVar42 < sVar63) * uVar42 | (ushort)((short)uVar42 >= sVar63) * sVar63) +
             auVar91._8_2_;
        auVar111._10_2_ =
             (((short)uVar43 < sVar64) * uVar43 | (ushort)((short)uVar43 >= sVar64) * sVar64) +
             auVar91._10_2_;
        auVar111._12_2_ =
             (((short)uVar44 < sVar65) * uVar44 | (ushort)((short)uVar44 >= sVar65) * sVar65) +
             auVar91._12_2_;
        auVar111._14_2_ =
             (((short)uVar45 < sVar66) * uVar45 | (ushort)((short)uVar45 >= sVar66) * sVar66) +
             auVar91._14_2_;
        auVar83._0_2_ =
             (((short)uVar67 < sVar89) * uVar67 | (ushort)((short)uVar67 >= sVar89) * sVar89) +
             auVar127._0_2_;
        auVar83._2_2_ =
             (((short)uVar74 < sVar103) * uVar74 | (ushort)((short)uVar74 >= sVar103) * sVar103) +
             auVar127._2_2_;
        auVar83._4_2_ =
             (((short)uVar75 < sVar50) * uVar75 | (ushort)((short)uVar75 >= sVar50) * sVar50) +
             auVar127._4_2_;
        auVar83._6_2_ =
             (((short)uVar76 < sVar51) * uVar76 | (ushort)((short)uVar76 >= sVar51) * sVar51) +
             auVar127._6_2_;
        auVar83._8_2_ =
             (((short)uVar77 < sVar52) * uVar77 | (ushort)((short)uVar77 >= sVar52) * sVar52) +
             auVar127._8_2_;
        auVar83._10_2_ =
             (((short)uVar78 < sVar53) * uVar78 | (ushort)((short)uVar78 >= sVar53) * sVar53) +
             auVar127._10_2_;
        auVar83._12_2_ =
             (((short)uVar79 < sVar54) * uVar79 | (ushort)((short)uVar79 >= sVar54) * sVar54) +
             auVar127._12_2_;
        auVar83._14_2_ =
             (((short)uVar81 < sVar55) * uVar81 | (ushort)((short)uVar81 >= sVar55) * sVar55) +
             auVar127._14_2_;
        auVar111 = auVar111 ^ auVar91;
        auVar83 = auVar83 ^ auVar127;
        uVar2 = *(undefined8 *)(in + lVar30);
        uVar3 = *(undefined8 *)(in + lVar30 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar30 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar30 + 0x1b0);
        auVar71._0_2_ = (short)uVar3 - sVar104;
        auVar71._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar105;
        auVar71._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar106;
        auVar71._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar107;
        auVar71._8_2_ = (short)uVar2 - sVar108;
        auVar71._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar109;
        auVar71._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar110;
        auVar71._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar120;
        auVar99._0_2_ = (short)uVar5 - sVar121;
        auVar99._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar122;
        auVar99._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar123;
        auVar99._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar124;
        auVar99._8_2_ = (short)uVar4 - sVar125;
        auVar99._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar126;
        auVar99._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar80;
        auVar99._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar82;
        auVar57 = pabsw(auVar131,auVar71);
        auVar46 = psraw(auVar71,0xf);
        uVar37 = auVar57._0_2_;
        auVar87._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar57._2_2_;
        auVar87._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar57._4_2_;
        auVar87._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar57._6_2_;
        auVar87._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar57._8_2_;
        auVar87._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar57._10_2_;
        auVar87._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar57._12_2_;
        uVar45 = auVar57._14_2_;
        auVar87._12_2_ = uVar44 >> uVar33;
        auVar87._14_2_ = uVar45 >> uVar33;
        auVar57 = pabsw(auVar135,auVar99);
        uVar67 = auVar57._0_2_;
        auVar141._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar57._2_2_;
        auVar141._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar57._4_2_;
        auVar141._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar57._6_2_;
        auVar141._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar57._8_2_;
        auVar141._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar57._10_2_;
        auVar141._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar57._12_2_;
        uVar81 = auVar57._14_2_;
        auVar141._12_2_ = uVar79 >> uVar33;
        auVar141._14_2_ = uVar81 >> uVar33;
        auVar68 = psraw(auVar99,0xf);
        auVar91 = psubusw(auVar32,auVar87);
        auVar57 = psubusw(auVar32,auVar141);
        sVar56 = auVar91._0_2_;
        sVar60 = auVar91._2_2_;
        sVar61 = auVar91._4_2_;
        sVar62 = auVar91._6_2_;
        sVar63 = auVar91._8_2_;
        sVar64 = auVar91._10_2_;
        sVar65 = auVar91._12_2_;
        sVar66 = auVar91._14_2_;
        sVar89 = auVar57._0_2_;
        sVar103 = auVar57._2_2_;
        sVar50 = auVar57._4_2_;
        sVar51 = auVar57._6_2_;
        sVar52 = auVar57._8_2_;
        sVar53 = auVar57._10_2_;
        sVar54 = auVar57._12_2_;
        sVar55 = auVar57._14_2_;
        auVar119._0_2_ =
             (((short)uVar37 < sVar56) * uVar37 | (ushort)((short)uVar37 >= sVar56) * sVar56) +
             auVar46._0_2_;
        auVar119._2_2_ =
             (((short)uVar39 < sVar60) * uVar39 | (ushort)((short)uVar39 >= sVar60) * sVar60) +
             auVar46._2_2_;
        auVar119._4_2_ =
             (((short)uVar40 < sVar61) * uVar40 | (ushort)((short)uVar40 >= sVar61) * sVar61) +
             auVar46._4_2_;
        auVar119._6_2_ =
             (((short)uVar41 < sVar62) * uVar41 | (ushort)((short)uVar41 >= sVar62) * sVar62) +
             auVar46._6_2_;
        auVar119._8_2_ =
             (((short)uVar42 < sVar63) * uVar42 | (ushort)((short)uVar42 >= sVar63) * sVar63) +
             auVar46._8_2_;
        auVar119._10_2_ =
             (((short)uVar43 < sVar64) * uVar43 | (ushort)((short)uVar43 >= sVar64) * sVar64) +
             auVar46._10_2_;
        auVar119._12_2_ =
             (((short)uVar44 < sVar65) * uVar44 | (ushort)((short)uVar44 >= sVar65) * sVar65) +
             auVar46._12_2_;
        auVar119._14_2_ =
             (((short)uVar45 < sVar66) * uVar45 | (ushort)((short)uVar45 >= sVar66) * sVar66) +
             auVar46._14_2_;
        auVar88._0_2_ =
             (((short)uVar67 < sVar89) * uVar67 | (ushort)((short)uVar67 >= sVar89) * sVar89) +
             auVar68._0_2_;
        auVar88._2_2_ =
             (((short)uVar74 < sVar103) * uVar74 | (ushort)((short)uVar74 >= sVar103) * sVar103) +
             auVar68._2_2_;
        auVar88._4_2_ =
             (((short)uVar75 < sVar50) * uVar75 | (ushort)((short)uVar75 >= sVar50) * sVar50) +
             auVar68._4_2_;
        auVar88._6_2_ =
             (((short)uVar76 < sVar51) * uVar76 | (ushort)((short)uVar76 >= sVar51) * sVar51) +
             auVar68._6_2_;
        auVar88._8_2_ =
             (((short)uVar77 < sVar52) * uVar77 | (ushort)((short)uVar77 >= sVar52) * sVar52) +
             auVar68._8_2_;
        auVar88._10_2_ =
             (((short)uVar78 < sVar53) * uVar78 | (ushort)((short)uVar78 >= sVar53) * sVar53) +
             auVar68._10_2_;
        auVar88._12_2_ =
             (((short)uVar79 < sVar54) * uVar79 | (ushort)((short)uVar79 >= sVar54) * sVar54) +
             auVar68._12_2_;
        auVar88._14_2_ =
             (((short)uVar81 < sVar55) * uVar81 | (ushort)((short)uVar81 >= sVar55) * sVar55) +
             auVar68._14_2_;
        in_XMM12 = auVar119 ^ auVar46;
        auVar88 = auVar88 ^ auVar68;
        uVar2 = *(undefined8 *)(in + -lVar30);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar30));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar30));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar30));
        auVar136._0_2_ = (short)uVar3 - sVar104;
        auVar136._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar105;
        auVar136._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar106;
        auVar136._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar107;
        auVar136._8_2_ = (short)uVar2 - sVar108;
        auVar136._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar109;
        auVar136._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar110;
        auVar136._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar120;
        auVar132._0_2_ = (short)uVar5 - sVar121;
        auVar132._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar122;
        auVar132._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar123;
        auVar132._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar124;
        auVar132._8_2_ = (short)uVar4 - sVar125;
        auVar132._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar126;
        auVar132._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar80;
        auVar132._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar82;
        auVar46 = pabsw(auVar141,auVar136);
        auVar36 = pabsw(auVar36,auVar132);
        uVar33 = (ulong)uVar27;
        uVar67 = auVar46._0_2_;
        auVar131._0_2_ = uVar67 >> uVar33;
        uVar74 = auVar46._2_2_;
        auVar131._2_2_ = uVar74 >> uVar33;
        uVar75 = auVar46._4_2_;
        auVar131._4_2_ = uVar75 >> uVar33;
        uVar76 = auVar46._6_2_;
        auVar131._6_2_ = uVar76 >> uVar33;
        uVar77 = auVar46._8_2_;
        auVar131._8_2_ = uVar77 >> uVar33;
        uVar78 = auVar46._10_2_;
        auVar131._10_2_ = uVar78 >> uVar33;
        uVar79 = auVar46._12_2_;
        uVar81 = auVar46._14_2_;
        auVar131._12_2_ = uVar79 >> uVar33;
        auVar131._14_2_ = uVar81 >> uVar33;
        uVar37 = auVar36._0_2_;
        auVar46._0_2_ = uVar37 >> uVar33;
        uVar39 = auVar36._2_2_;
        auVar46._2_2_ = uVar39 >> uVar33;
        uVar40 = auVar36._4_2_;
        auVar46._4_2_ = uVar40 >> uVar33;
        uVar41 = auVar36._6_2_;
        auVar46._6_2_ = uVar41 >> uVar33;
        uVar42 = auVar36._8_2_;
        auVar46._8_2_ = uVar42 >> uVar33;
        uVar43 = auVar36._10_2_;
        auVar46._10_2_ = uVar43 >> uVar33;
        uVar44 = auVar36._12_2_;
        uVar45 = auVar36._14_2_;
        auVar46._12_2_ = uVar44 >> uVar33;
        auVar46._14_2_ = uVar45 >> uVar33;
        auVar57 = psubusw(auVar32,auVar131);
        auVar36 = psubusw(auVar32,auVar46);
        sVar56 = auVar57._0_2_;
        sVar60 = auVar57._2_2_;
        sVar61 = auVar57._4_2_;
        sVar62 = auVar57._6_2_;
        sVar63 = auVar57._8_2_;
        sVar64 = auVar57._10_2_;
        sVar65 = auVar57._12_2_;
        sVar66 = auVar57._14_2_;
        sVar89 = auVar36._0_2_;
        sVar103 = auVar36._2_2_;
        sVar50 = auVar36._4_2_;
        sVar51 = auVar36._6_2_;
        sVar52 = auVar36._8_2_;
        sVar53 = auVar36._10_2_;
        sVar54 = auVar36._12_2_;
        sVar55 = auVar36._14_2_;
        in_XMM14 = psraw(auVar136,0xf);
        auVar100._0_2_ =
             (((short)uVar67 < sVar56) * uVar67 | (ushort)((short)uVar67 >= sVar56) * sVar56) +
             in_XMM14._0_2_;
        auVar100._2_2_ =
             (((short)uVar74 < sVar60) * uVar74 | (ushort)((short)uVar74 >= sVar60) * sVar60) +
             in_XMM14._2_2_;
        auVar100._4_2_ =
             (((short)uVar75 < sVar61) * uVar75 | (ushort)((short)uVar75 >= sVar61) * sVar61) +
             in_XMM14._4_2_;
        auVar100._6_2_ =
             (((short)uVar76 < sVar62) * uVar76 | (ushort)((short)uVar76 >= sVar62) * sVar62) +
             in_XMM14._6_2_;
        auVar100._8_2_ =
             (((short)uVar77 < sVar63) * uVar77 | (ushort)((short)uVar77 >= sVar63) * sVar63) +
             in_XMM14._8_2_;
        auVar100._10_2_ =
             (((short)uVar78 < sVar64) * uVar78 | (ushort)((short)uVar78 >= sVar64) * sVar64) +
             in_XMM14._10_2_;
        auVar100._12_2_ =
             (((short)uVar79 < sVar65) * uVar79 | (ushort)((short)uVar79 >= sVar65) * sVar65) +
             in_XMM14._12_2_;
        auVar100._14_2_ =
             (((short)uVar81 < sVar66) * uVar81 | (ushort)((short)uVar81 >= sVar66) * sVar66) +
             in_XMM14._14_2_;
        auVar100 = auVar100 ^ in_XMM14;
        auVar36 = psraw(auVar132,0xf);
        auVar135._0_2_ =
             (((short)uVar37 < sVar89) * uVar37 | (ushort)((short)uVar37 >= sVar89) * sVar89) +
             auVar36._0_2_;
        auVar135._2_2_ =
             (((short)uVar39 < sVar103) * uVar39 | (ushort)((short)uVar39 >= sVar103) * sVar103) +
             auVar36._2_2_;
        auVar135._4_2_ =
             (((short)uVar40 < sVar50) * uVar40 | (ushort)((short)uVar40 >= sVar50) * sVar50) +
             auVar36._4_2_;
        auVar135._6_2_ =
             (((short)uVar41 < sVar51) * uVar41 | (ushort)((short)uVar41 >= sVar51) * sVar51) +
             auVar36._6_2_;
        auVar135._8_2_ =
             (((short)uVar42 < sVar52) * uVar42 | (ushort)((short)uVar42 >= sVar52) * sVar52) +
             auVar36._8_2_;
        auVar135._10_2_ =
             (((short)uVar43 < sVar53) * uVar43 | (ushort)((short)uVar43 >= sVar53) * sVar53) +
             auVar36._10_2_;
        auVar135._12_2_ =
             (((short)uVar44 < sVar54) * uVar44 | (ushort)((short)uVar44 >= sVar54) * sVar54) +
             auVar36._12_2_;
        auVar135._14_2_ =
             (((short)uVar45 < sVar55) * uVar45 | (ushort)((short)uVar45 >= sVar55) * sVar55) +
             auVar36._14_2_;
        auVar135 = auVar135 ^ auVar36;
        local_28 = auVar35._0_2_;
        sStack_26 = auVar35._2_2_;
        sVar89 = auVar34._0_2_;
        sVar103 = auVar34._2_2_;
        auVar101._0_2_ =
             (auVar100._0_2_ + in_XMM12._0_2_) * sVar89 +
             (auVar111._0_2_ + auVar86._0_2_) * local_28;
        auVar101._2_2_ =
             (auVar100._2_2_ + in_XMM12._2_2_) * sVar103 +
             (auVar111._2_2_ + auVar86._2_2_) * sStack_26;
        auVar101._4_2_ =
             (auVar100._4_2_ + in_XMM12._4_2_) * sVar89 +
             (auVar111._4_2_ + auVar86._4_2_) * local_28;
        auVar101._6_2_ =
             (auVar100._6_2_ + in_XMM12._6_2_) * sVar103 +
             (auVar111._6_2_ + auVar86._6_2_) * sStack_26;
        auVar101._8_2_ =
             (auVar100._8_2_ + in_XMM12._8_2_) * sVar89 +
             (auVar111._8_2_ + auVar86._8_2_) * local_28;
        auVar101._10_2_ =
             (auVar100._10_2_ + in_XMM12._10_2_) * sVar103 +
             (auVar111._10_2_ + auVar86._10_2_) * sStack_26;
        auVar101._12_2_ =
             (auVar100._12_2_ + in_XMM12._12_2_) * sVar89 +
             (auVar111._12_2_ + auVar86._12_2_) * local_28;
        auVar101._14_2_ =
             (auVar100._14_2_ + in_XMM12._14_2_) * sVar103 +
             (auVar111._14_2_ + auVar86._14_2_) * sStack_26;
        auVar72._0_2_ =
             (auVar135._0_2_ + auVar88._0_2_) * sVar89 + (auVar83._0_2_ + auVar133._0_2_) * local_28
        ;
        auVar72._2_2_ =
             (auVar135._2_2_ + auVar88._2_2_) * sVar103 +
             (auVar83._2_2_ + auVar133._2_2_) * sStack_26;
        auVar72._4_2_ =
             (auVar135._4_2_ + auVar88._4_2_) * sVar89 + (auVar83._4_2_ + auVar133._4_2_) * local_28
        ;
        auVar72._6_2_ =
             (auVar135._6_2_ + auVar88._6_2_) * sVar103 +
             (auVar83._6_2_ + auVar133._6_2_) * sStack_26;
        auVar72._8_2_ =
             (auVar135._8_2_ + auVar88._8_2_) * sVar89 + (auVar83._8_2_ + auVar133._8_2_) * local_28
        ;
        auVar72._10_2_ =
             (auVar135._10_2_ + auVar88._10_2_) * sVar103 +
             (auVar83._10_2_ + auVar133._10_2_) * sStack_26;
        auVar72._12_2_ =
             (auVar135._12_2_ + auVar88._12_2_) * sVar89 +
             (auVar83._12_2_ + auVar133._12_2_) * local_28;
        auVar72._14_2_ =
             (auVar135._14_2_ + auVar88._14_2_) * sVar103 +
             (auVar83._14_2_ + auVar133._14_2_) * sStack_26;
        auVar36 = psraw(auVar101,0xf);
        auVar46 = pmovsxbw(auVar46,0x808080808080808);
        auVar102._0_2_ = auVar101._0_2_ + auVar46._0_2_ + auVar36._0_2_;
        auVar102._2_2_ = auVar101._2_2_ + auVar46._2_2_ + auVar36._2_2_;
        auVar102._4_2_ = auVar101._4_2_ + auVar46._4_2_ + auVar36._4_2_;
        auVar102._6_2_ = auVar101._6_2_ + auVar46._6_2_ + auVar36._6_2_;
        auVar102._8_2_ = auVar101._8_2_ + auVar46._8_2_ + auVar36._8_2_;
        auVar102._10_2_ = auVar101._10_2_ + auVar46._10_2_ + auVar36._10_2_;
        auVar102._12_2_ = auVar101._12_2_ + auVar46._12_2_ + auVar36._12_2_;
        auVar102._14_2_ = auVar101._14_2_ + auVar46._14_2_ + auVar36._14_2_;
        auVar36 = psraw(auVar72,0xf);
        auVar73._0_2_ = auVar72._0_2_ + auVar46._0_2_ + auVar36._0_2_;
        auVar73._2_2_ = auVar72._2_2_ + auVar46._2_2_ + auVar36._2_2_;
        auVar73._4_2_ = auVar72._4_2_ + auVar46._4_2_ + auVar36._4_2_;
        auVar73._6_2_ = auVar72._6_2_ + auVar46._6_2_ + auVar36._6_2_;
        auVar73._8_2_ = auVar72._8_2_ + auVar46._8_2_ + auVar36._8_2_;
        auVar73._10_2_ = auVar72._10_2_ + auVar46._10_2_ + auVar36._10_2_;
        auVar73._12_2_ = auVar72._12_2_ + auVar46._12_2_ + auVar36._12_2_;
        auVar73._14_2_ = auVar72._14_2_ + auVar46._14_2_ + auVar36._14_2_;
        auVar46 = psraw(auVar102,4);
        sVar104 = auVar46._0_2_ + sVar104;
        sVar105 = auVar46._2_2_ + sVar105;
        sVar106 = auVar46._4_2_ + sVar106;
        sVar107 = auVar46._6_2_ + sVar107;
        sVar108 = auVar46._8_2_ + sVar108;
        sVar109 = auVar46._10_2_ + sVar109;
        sVar110 = auVar46._12_2_ + sVar110;
        sVar120 = auVar46._14_2_ + sVar120;
        auVar46 = psraw(auVar73,4);
        sVar121 = auVar46._0_2_ + sVar121;
        sVar122 = auVar46._2_2_ + sVar122;
        sVar123 = auVar46._4_2_ + sVar123;
        sVar124 = auVar46._6_2_ + sVar124;
        sVar125 = auVar46._8_2_ + sVar125;
        sVar126 = auVar46._10_2_ + sVar126;
        sVar80 = auVar46._12_2_ + sVar80;
        sVar82 = auVar46._14_2_ + sVar82;
        *(char *)((long)dest + 0xc) =
             (0 < sVar108) * (sVar108 < 0x100) * (char)sVar108 - (0xff < sVar108);
        *(char *)((long)dest + 0xd) =
             (0 < sVar109) * (sVar109 < 0x100) * (char)sVar109 - (0xff < sVar109);
        *(char *)((long)dest + 0xe) =
             (0 < sVar110) * (sVar110 < 0x100) * (char)sVar110 - (0xff < sVar110);
        *(char *)((long)dest + 0xf) =
             (0 < sVar120) * (sVar120 < 0x100) * (char)sVar120 - (0xff < sVar120);
        *(char *)((long)dest + lVar29 + 8) =
             (0 < sVar104) * (sVar104 < 0x100) * (char)sVar104 - (0xff < sVar104);
        *(char *)((long)dest + lVar29 + 9) =
             (0 < sVar105) * (sVar105 < 0x100) * (char)sVar105 - (0xff < sVar105);
        *(char *)((long)dest + lVar29 + 10) =
             (0 < sVar106) * (sVar106 < 0x100) * (char)sVar106 - (0xff < sVar106);
        *(char *)((long)dest + lVar29 + 0xb) =
             (0 < sVar107) * (sVar107 < 0x100) * (char)sVar107 - (0xff < sVar107);
        *(char *)((long)dest + lVar29 * 2 + 4) =
             (0 < sVar125) * (sVar125 < 0x100) * (char)sVar125 - (0xff < sVar125);
        *(char *)((long)dest + lVar29 * 2 + 5) =
             (0 < sVar126) * (sVar126 < 0x100) * (char)sVar126 - (0xff < sVar126);
        *(char *)((long)dest + lVar29 * 2 + 6) =
             (0 < sVar80) * (sVar80 < 0x100) * (char)sVar80 - (0xff < sVar80);
        *(char *)((long)dest + lVar29 * 2 + 7) =
             (0 < sVar82) * (sVar82 < 0x100) * (char)sVar82 - (0xff < sVar82);
        pcVar1 = (char *)((long)dest + lVar29 * 3);
        *pcVar1 = (0 < sVar121) * (sVar121 < 0x100) * (char)sVar121 - (0xff < sVar121);
        pcVar1[1] = (0 < sVar122) * (sVar122 < 0x100) * (char)sVar122 - (0xff < sVar122);
        pcVar1[2] = (0 < sVar123) * (sVar123 < 0x100) * (char)sVar123 - (0xff < sVar123);
        pcVar1[3] = (0 < sVar124) * (sVar124 < 0x100) * (char)sVar124 - (0xff < sVar124);
        uVar28 = uVar28 + 4;
        in = in + 0x240;
        dest = (void *)((long)dest + lVar29 * 4);
      } while (uVar28 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_1)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}